

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_b44.c
# Opt level: O3

exr_result_t compress_b44_impl(exr_encode_pipeline_t *encode,int flat_field)

{
  int iVar1;
  uint8_t uVar2;
  uint uVar3;
  uint uVar4;
  exr_coding_channel_info_t *peVar5;
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  int i_2;
  exr_result_t eVar9;
  int iVar10;
  uint uVar11;
  int i;
  uint uVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  void *__src;
  ushort *__dest;
  long lVar16;
  uint uVar17;
  uint uVar18;
  exr_coding_channel_info_t *peVar19;
  void *pvVar20;
  undefined8 *puVar21;
  undefined8 *puVar22;
  uint uVar23;
  size_t sVar24;
  undefined8 *puVar25;
  byte bVar26;
  long lVar27;
  uint uVar28;
  long lVar29;
  undefined8 *puVar30;
  ulong uVar31;
  size_t sVar32;
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [16];
  short sVar38;
  short sVar43;
  short sVar44;
  short sVar46;
  undefined4 uVar45;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  ushort uVar47;
  uint16_t s [16];
  int d [16];
  uint16_t t [16];
  void *local_1c8;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  uint local_138 [32];
  ulong local_b8;
  long local_b0;
  long local_a8;
  exr_coding_channel_info_t *local_a0;
  undefined8 *local_98;
  undefined8 *local_90;
  undefined8 *local_88;
  undefined8 *local_80;
  size_t local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58 [5];
  undefined1 auVar36 [16];
  ushort uVar37;
  undefined1 auVar41 [16];
  
  __dest = (ushort *)encode->compressed_buffer;
  eVar9 = internal_encode_alloc_buffer
                    (encode,EXR_TRANSCODE_BUFFER_SCRATCH1,&encode->scratch_buffer_1,
                     &encode->scratch_alloc_size_1,encode->packed_bytes);
  if (eVar9 == 0) {
    iVar10 = (encode->chunk).height;
    if (iVar10 < 1) {
      sVar38 = encode->channel_count;
    }
    else {
      __src = encode->packed_buffer;
      sVar38 = encode->channel_count;
      uVar31 = 0;
      do {
        uVar12 = (uint)uVar31;
        if (0 < sVar38) {
          iVar10 = (encode->chunk).start_y;
          pvVar20 = encode->scratch_buffer_1;
          lVar29 = 0x19;
          lVar16 = 0;
          do {
            peVar5 = encode->channels;
            sVar24 = (long)*(char *)((long)&peVar5->channel_name + lVar29) *
                     (long)*(int *)((long)peVar5 + lVar29 + -0xd);
            lVar27 = (long)*(int *)((long)peVar5 + lVar29 + -0x11) * sVar24;
            if (lVar27 != 0) {
              uVar3 = *(uint *)((long)peVar5 + lVar29 + -5);
              uVar11 = uVar12;
              if (1 < (int)uVar3) {
                if ((int)(iVar10 + uVar12) % (int)uVar3 != 0) {
                  pvVar20 = (void *)((long)pvVar20 + lVar27);
                  goto LAB_0010529a;
                }
                uVar11 = (uint)(uVar31 / uVar3);
              }
              memcpy((void *)(uVar11 * sVar24 + (long)pvVar20),__src,sVar24);
              __src = (void *)((long)__src + sVar24);
              pvVar20 = (void *)((long)pvVar20 + lVar27);
              sVar38 = encode->channel_count;
            }
LAB_0010529a:
            lVar16 = lVar16 + 1;
            lVar29 = lVar29 + 0x30;
          } while (lVar16 < sVar38);
          iVar10 = (encode->chunk).height;
        }
        uVar31 = (ulong)(uVar12 + 1);
      } while ((int)(uVar12 + 1) < iVar10);
    }
    if (sVar38 < 1) {
      sVar32 = 0;
    }
    else {
      local_1c8 = encode->scratch_buffer_1;
      local_b0 = 0;
      sVar32 = 0;
      do {
        peVar5 = encode->channels;
        iVar10 = peVar5[local_b0].width;
        lVar29 = (long)iVar10;
        lVar16 = (long)peVar5[local_b0].height;
        sVar24 = lVar16 * lVar29 * (long)peVar5[local_b0].bytes_per_element;
        if (sVar24 != 0) {
          peVar19 = peVar5 + local_b0;
          if (peVar19->data_type == 1) {
            if (0 < peVar5[local_b0].height) {
              uVar31 = 0;
              do {
                local_b8 = uVar31;
                puVar21 = (undefined8 *)((long)local_1c8 + local_b8 * lVar29 * 2);
                puVar22 = (undefined8 *)((long)puVar21 + lVar29 * 2);
                puVar30 = (undefined8 *)((long)puVar22 + lVar29 * 2);
                if ((long)(local_b8 | 3) < lVar16) {
                  puVar25 = (undefined8 *)((long)puVar30 + lVar29 * 2);
                }
                else {
                  if (lVar16 <= (long)(local_b8 | 1)) {
                    puVar22 = puVar21;
                  }
                  puVar25 = puVar30;
                  if (lVar16 <= (long)(local_b8 | 2)) {
                    puVar25 = puVar22;
                    puVar30 = puVar22;
                  }
                }
                if (0 < iVar10) {
                  uVar12 = 0;
                  do {
                    local_78 = sVar32;
                    if ((int)(uVar12 | 3) < iVar10) {
                      local_158 = *puVar21;
                      local_150 = *puVar22;
                      local_148 = *puVar30;
                      local_140 = *puVar25;
                    }
                    else {
                      lVar27 = 0;
                      do {
                        iVar14 = ~uVar12 + iVar10;
                        if ((int)lVar27 < (int)(~uVar12 + iVar10)) {
                          iVar14 = (int)lVar27;
                        }
                        lVar13 = (long)iVar14;
                        *(undefined2 *)((long)&local_158 + lVar27 * 2) =
                             *(undefined2 *)((long)puVar21 + lVar13 * 2);
                        *(undefined2 *)((long)&local_150 + lVar27 * 2) =
                             *(undefined2 *)((long)puVar22 + lVar13 * 2);
                        *(undefined2 *)((long)&local_148 + lVar27 * 2) =
                             *(undefined2 *)((long)puVar30 + lVar13 * 2);
                        *(undefined2 *)((long)&local_140 + lVar27 * 2) =
                             *(undefined2 *)((long)puVar25 + lVar13 * 2);
                        lVar27 = lVar27 + 1;
                      } while (lVar27 != 4);
                    }
                    uVar2 = peVar19->p_linear;
                    if (uVar2 != '\0') {
                      lVar27 = 0;
                      do {
                        *(uint16_t *)((long)&local_158 + lVar27 * 2) =
                             exrcore_expTable[*(ushort *)((long)&local_158 + lVar27 * 2)];
                        lVar27 = lVar27 + 1;
                      } while (lVar27 != 0x10);
                    }
                    puVar21 = puVar21 + 1;
                    puVar22 = puVar22 + 1;
                    puVar30 = puVar30 + 1;
                    puVar25 = puVar25 + 1;
                    lVar27 = 0;
                    do {
                      uVar37 = *(ushort *)((long)&local_158 + lVar27 * 2);
                      if ((~uVar37 & 0x7c00) == 0) {
                        *(undefined2 *)((long)local_58 + lVar27 * 2) = 0x8000;
                      }
                      else {
                        if ((short)uVar37 < 0) {
                          uVar37 = ~uVar37;
                        }
                        else {
                          uVar37 = uVar37 | 0x8000;
                        }
                        *(ushort *)((long)local_58 + lVar27 * 2) = uVar37;
                      }
                      lVar27 = lVar27 + 1;
                    } while (lVar27 != 0x10);
                    lVar27 = 0;
                    auVar40 = (undefined1  [16])0x0;
                    do {
                      auVar35 = psubusw(*(undefined1 (*) [16])((long)local_58 + lVar27 * 2),auVar40)
                      ;
                      auVar33._0_2_ = auVar35._0_2_ + auVar40._0_2_;
                      auVar33._2_2_ = auVar35._2_2_ + auVar40._2_2_;
                      auVar33._4_2_ = auVar35._4_2_ + auVar40._4_2_;
                      auVar33._6_2_ = auVar35._6_2_ + auVar40._6_2_;
                      auVar33._8_2_ = auVar35._8_2_ + auVar40._8_2_;
                      auVar33._10_2_ = auVar35._10_2_ + auVar40._10_2_;
                      auVar36._12_2_ = auVar35._12_2_ + auVar40._12_2_;
                      auVar36._0_12_ = auVar33;
                      auVar36._14_2_ = auVar35._14_2_ + auVar40._14_2_;
                      lVar27 = lVar27 + 8;
                      auVar40 = auVar36;
                    } while (lVar27 != 0x10);
                    auVar39._4_4_ = auVar36._12_4_;
                    auVar39._0_4_ = auVar33._8_4_;
                    auVar39._8_4_ = auVar33._8_4_;
                    auVar39._12_4_ = auVar36._12_4_;
                    auVar40 = psubusw(auVar39,auVar36);
                    sVar38 = auVar40._0_2_ + auVar33._0_2_;
                    sVar43 = auVar40._2_2_ + auVar33._2_2_;
                    sVar44 = auVar40._4_2_ + auVar33._4_2_;
                    sVar46 = auVar40._6_2_ + auVar33._6_2_;
                    auVar41._0_8_ = CONCAT26(sVar46,CONCAT24(sVar44,CONCAT22(sVar43,sVar38)));
                    auVar41._8_2_ = auVar40._8_2_ + auVar33._8_2_;
                    auVar41._10_2_ = auVar40._10_2_ + auVar33._10_2_;
                    auVar41._12_2_ = auVar40._12_2_ + auVar36._12_2_;
                    auVar41._14_2_ = auVar40._14_2_ + auVar36._14_2_;
                    uVar45 = (undefined4)((ulong)auVar41._0_8_ >> 0x20);
                    auVar40._4_4_ = uVar45;
                    auVar40._0_4_ = uVar45;
                    auVar40._8_4_ = uVar45;
                    auVar40._12_4_ = uVar45;
                    auVar40 = psubusw(auVar40,auVar41);
                    sVar38 = auVar40._0_2_ + sVar38;
                    uVar37 = auVar40._2_2_ + sVar43;
                    auVar34._0_8_ =
                         CONCAT26(auVar40._6_2_ + sVar46,
                                  CONCAT24(auVar40._4_2_ + sVar44,CONCAT22(uVar37,sVar38)));
                    auVar34._8_2_ = auVar40._8_2_ + auVar41._8_2_;
                    auVar34._10_2_ = auVar40._10_2_ + auVar41._10_2_;
                    auVar35._12_2_ = auVar40._12_2_ + auVar41._12_2_;
                    auVar35._0_12_ = auVar34;
                    auVar35._14_2_ = auVar40._14_2_ + auVar41._14_2_;
                    auVar42._2_2_ = 0;
                    auVar42._0_2_ = uVar37;
                    auVar42._4_4_ = (uint)((ulong)auVar34._0_8_ >> 0x30);
                    auVar42._8_4_ = auVar34._8_4_ >> 0x10;
                    auVar42._12_4_ = auVar35._12_4_ >> 0x10;
                    auVar40 = psubusw(auVar42,auVar35);
                    uVar37 = auVar40._0_2_ + sVar38;
                    uVar3 = (uint)uVar37;
                    iVar14 = -1;
                    do {
                      iVar1 = iVar14 + 1;
                      bVar26 = (byte)iVar1;
                      uVar11 = iVar14 + 2;
                      uVar15 = ~(-1 << (bVar26 & 0x1f));
                      lVar27 = 0;
                      do {
                        uVar31 = *(ulong *)((long)local_58 + lVar27 * 2);
                        uVar47 = (ushort)(uVar31 >> 0x30);
                        auVar6._8_4_ = 0;
                        auVar6._0_8_ = uVar31;
                        auVar6._12_2_ = uVar47;
                        auVar7._8_2_ = (short)(uVar31 >> 0x20);
                        auVar7._0_8_ = uVar31;
                        auVar7._10_4_ = auVar6._10_4_;
                        auVar8._6_8_ = 0;
                        auVar8._0_6_ = auVar7._8_6_;
                        uVar17 = (uVar3 - (ushort)uVar31) * 2;
                        uVar18 = (uVar3 - (int)CONCAT82(SUB148(auVar8 << 0x40,6),
                                                        (short)(uVar31 >> 0x10))) * 2;
                        uVar23 = (uVar3 - auVar7._8_4_) * 2;
                        uVar28 = (uVar3 - uVar47) * 2;
                        uVar31 = (ulong)uVar11;
                        local_138[lVar27] =
                             (int)(uVar17 + uVar15 + (uVar17 >> uVar31 & 1)) >> ZEXT416(uVar11);
                        local_138[lVar27 + 1] =
                             (int)(uVar18 + uVar15 + (uVar18 >> uVar31 & 1)) >> ZEXT416(uVar11);
                        local_138[lVar27 + 2] =
                             (int)(uVar23 + uVar15 + (uVar23 >> uVar31 & 1)) >> ZEXT416(uVar11);
                        local_138[lVar27 + 3] =
                             (int)(uVar28 + uVar15 + (uVar28 >> uVar31 & 1)) >> ZEXT416(uVar11);
                        lVar27 = lVar27 + 4;
                      } while (lVar27 != 0x10);
                      uVar28 = local_138[0] - local_138[4];
                      local_70 = (ulong)uVar28;
                      uVar17 = local_138[4] - local_138[8];
                      local_68 = (ulong)uVar17;
                      local_138[0x11] = uVar17 + 0x20;
                      local_138[0x12] = (local_138[8] - local_138[0xc]) + 0x20;
                      local_138[0x13] = (local_138[0] - local_138[1]) + 0x20;
                      local_138[0x14] = (local_138[4] - local_138[5]) + 0x20;
                      local_138[0x15] = (local_138[8] - local_138[9]) + 0x20;
                      local_138[0x16] = (local_138[0xc] - local_138[0xd]) + 0x20;
                      local_138[0x17] = (local_138[1] - local_138[2]) + 0x20;
                      local_138[0x18] = (local_138[5] - local_138[6]) + 0x20;
                      local_138[0x19] = (local_138[9] - local_138[10]) + 0x20;
                      local_138[0x1a] = (local_138[0xd] - local_138[0xe]) + 0x20;
                      local_138[0x1b] = (local_138[2] - local_138[3]) + 0x20;
                      local_138[0x1c] = (local_138[6] - local_138[7]) + 0x20;
                      uVar18 = local_138[10] - local_138[0xb];
                      local_60 = (ulong)uVar18;
                      local_138[0x1d] = uVar18 + 0x20;
                      local_138[0x1e] = (local_138[0xe] - local_138[0xf]) + 0x20;
                      uVar23 = uVar28 + 0x20;
                      lVar27 = 1;
                      uVar11 = uVar23;
                      uVar15 = uVar23;
                      do {
                        uVar4 = local_138[lVar27 + 0x10];
                        if ((int)uVar4 <= (int)uVar15) {
                          uVar15 = uVar4;
                        }
                        if ((int)uVar4 < (int)uVar11) {
                          uVar4 = uVar11;
                        }
                        uVar11 = uVar4;
                        lVar27 = lVar27 + 1;
                      } while (lVar27 != 0xf);
                      iVar14 = iVar1;
                    } while (((int)uVar15 < 0) || (0x3f < (int)uVar11));
                    uVar47 = (ushort)local_58[0];
                    if ((flat_field == 0) || ((uVar15 != 0x20 || (uVar11 != 0x20)))) {
                      if (uVar2 == '\0') {
                        uVar47 = uVar37 - (short)(local_138[0] << (bVar26 & 0x1f));
                      }
                      *(byte *)(__dest + 1) = (byte)(uVar23 >> 4) | bVar26 * '\x04';
                      *(byte *)((long)__dest + 3) =
                           (byte)(uVar17 + 0x20 >> 2) | (char)uVar28 * '\x10';
                      *(byte *)(__dest + 2) = (byte)local_138[0x12] | (char)uVar17 * '@';
                      *(byte *)((long)__dest + 5) =
                           (byte)(local_138[0x14] >> 4) | (char)local_138[0x13] * '\x04';
                      *(byte *)(__dest + 3) =
                           (byte)(local_138[0x15] >> 2) |
                           (char)(local_138[4] - local_138[5]) * '\x10';
                      *(byte *)((long)__dest + 7) =
                           (byte)local_138[0x16] | (char)(local_138[8] - local_138[9]) * '@';
                      *(byte *)(__dest + 4) =
                           (byte)(local_138[0x18] >> 4) | (char)local_138[0x17] * '\x04';
                      *(byte *)((long)__dest + 9) =
                           (byte)(local_138[0x19] >> 2) |
                           (char)(local_138[5] - local_138[6]) * '\x10';
                      *(byte *)(__dest + 5) =
                           (byte)local_138[0x1a] | (char)(local_138[9] - local_138[10]) * '@';
                      *(byte *)((long)__dest + 0xb) =
                           (byte)(local_138[0x1c] >> 4) | (char)local_138[0x1b] * '\x04';
                      *(byte *)(__dest + 6) =
                           (byte)(uVar18 + 0x20 >> 2) | (char)(local_138[6] - local_138[7]) * '\x10'
                      ;
                      bVar26 = (byte)local_138[0x1e] | (char)uVar18 * '@';
                      lVar27 = 0xe;
                      lVar13 = 0xd;
                    }
                    else {
                      lVar27 = 3;
                      bVar26 = 0xfc;
                      lVar13 = 2;
                    }
                    *__dest = uVar47 << 8 | uVar47 >> 8;
                    *(byte *)((long)__dest + lVar13) = bVar26;
                    if (encode->compressed_alloc_size < lVar27 + local_78 + 0xe) {
                      return 1;
                    }
                    sVar32 = local_78 + lVar27;
                    uVar12 = uVar12 + 4;
                    __dest = (ushort *)((long)__dest + lVar27);
                    local_98 = puVar25;
                    local_90 = puVar30;
                    local_88 = puVar22;
                    local_80 = puVar21;
                  } while ((int)uVar12 < iVar10);
                }
                uVar31 = local_b8 + 4;
                local_a8 = lVar29;
                local_a0 = peVar19;
              } while ((long)(local_b8 + 4) < lVar16);
            }
            local_1c8 = (void *)((long)local_1c8 + sVar24);
          }
          else {
            sVar32 = sVar32 + sVar24;
            if (encode->compressed_alloc_size < sVar32) {
              return 1;
            }
            memcpy(__dest,local_1c8,sVar24);
            __dest = (ushort *)((long)__dest + sVar24);
            local_1c8 = (void *)((long)local_1c8 + sVar24);
          }
        }
        local_b0 = local_b0 + 1;
      } while (local_b0 < encode->channel_count);
    }
    encode->compressed_bytes = sVar32;
    eVar9 = 0;
  }
  return eVar9;
}

Assistant:

static exr_result_t
compress_b44_impl (exr_encode_pipeline_t* encode, int flat_field)
{
    uint8_t*       out  = (uint8_t*) encode->compressed_buffer;
    uint64_t       nOut = 0;
    uint8_t *      scratch, *tmp;
    const uint8_t* packed;
    int            nx, ny, wcount;
    uint64_t       bpl, nBytes;
    exr_result_t   rv;

    rv = internal_encode_alloc_buffer (
        encode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(encode->scratch_buffer_1),
        &(encode->scratch_alloc_size_1),
        encode->packed_bytes);
    if (rv != EXR_ERR_SUCCESS) return rv;

    nOut   = 0;
    packed = (const uint8_t*) encode->packed_buffer;
    for (int y = 0; y < encode->chunk.height; ++y)
    {
        int cury = y + encode->chunk.start_y;

        scratch = (uint8_t*) encode->scratch_buffer_1;
        for (int c = 0; c < encode->channel_count; ++c)
        {
            const exr_coding_channel_info_t* curc = encode->channels + c;

            nx     = curc->width;
            ny     = curc->height;
            bpl    = ((uint64_t) (nx)) * (uint64_t) (curc->bytes_per_element);
            nBytes = ((uint64_t) (ny)) * bpl;

            if (nBytes == 0) continue;

            tmp = scratch;
            if (curc->y_samples > 1)
            {
                if ((cury % curc->y_samples) != 0)
                {
                    scratch += nBytes;
                    continue;
                }
                tmp += ((uint64_t) (y / curc->y_samples)) * bpl;
            }
            else { tmp += ((uint64_t) y) * bpl; }

            memcpy (tmp, packed, bpl);
            if (curc->data_type == EXR_PIXEL_HALF) priv_to_native16 (tmp, nx);
            packed += bpl;
            scratch += nBytes;
        }
    }

    nOut    = 0;
    scratch = (uint8_t*) encode->scratch_buffer_1;
    for (int c = 0; c < encode->channel_count; ++c)
    {
        const exr_coding_channel_info_t* curc = encode->channels + c;

        nx     = curc->width;
        ny     = curc->height;
        bpl    = (uint64_t) (nx) * (uint64_t) (curc->bytes_per_element);
        nBytes = ((uint64_t) (ny)) * bpl;

        if (nBytes == 0) continue;

        if (curc->data_type != EXR_PIXEL_HALF)
        {
            if (nOut + nBytes > encode->compressed_alloc_size)
                return EXR_ERR_OUT_OF_MEMORY;
            memcpy (out, scratch, nBytes);
            out += nBytes;
            scratch += nBytes;
            nOut += nBytes;
            continue;
        }

        for (int y = 0; y < ny; y += 4)
        {
            //
            // Copy the next 4x4 pixel block into array s.
            // If the width, cd.nx, or the height, cd.ny, of
            // the pixel data in _tmpBuffer is not divisible
            // by 4, then pad the data by repeating the
            // rightmost column and the bottom row.
            //

            uint16_t* row0 = (uint16_t*) scratch;
            row0 += y * nx;
            uint16_t* row1 = row0 + nx;
            uint16_t* row2 = row1 + nx;
            uint16_t* row3 = row2 + nx;

            if (y + 3 >= ny)
            {
                if (y + 1 >= ny) row1 = row0;
                if (y + 2 >= ny) row2 = row1;

                row3 = row2;
            }

            for (int x = 0; x < nx; x += 4)
            {
                uint16_t s[16];

                if (x + 3 >= nx)
                {
                    int n = nx - x;

                    for (int i = 0; i < 4; ++i)
                    {
                        int j = i;
                        if (j > n - 1) j = n - 1;

                        s[i + 0]  = row0[j];
                        s[i + 4]  = row1[j];
                        s[i + 8]  = row2[j];
                        s[i + 12] = row3[j];
                    }
                }
                else
                {
                    memcpy (&s[0], row0, 4 * sizeof (uint16_t));
                    memcpy (&s[4], row1, 4 * sizeof (uint16_t));
                    memcpy (&s[8], row2, 4 * sizeof (uint16_t));
                    memcpy (&s[12], row3, 4 * sizeof (uint16_t));
                }

                row0 += 4;
                row1 += 4;
                row2 += 4;
                row3 += 4;

                //
                // Compress the contents of array s and append the
                // results to the output buffer.
                //

                if (curc->p_linear) convertFromLinear (s);

                wcount = pack (s, out, flat_field, !(curc->p_linear));
                out += wcount;
                nOut += (uint64_t) wcount;
                if (nOut + 14 > encode->compressed_alloc_size)
                    return EXR_ERR_OUT_OF_MEMORY;
            }
        }
        scratch += nBytes;
    }

    encode->compressed_bytes = nOut;
    return rv;
}